

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O3

TIntermTyped * __thiscall
glslang::TIntermediate::addSelection
          (TIntermediate *this,TIntermTyped *cond,TIntermTyped *trueBlock,TIntermTyped *falseBlock,
          TSourceLoc *loc)

{
  ulong uVar1;
  _Tp_alloc_type node1;
  char cVar2;
  bool bVar3;
  int iVar4;
  TBasicType t;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TType *pTVar5;
  undefined4 extraout_var_01;
  long lVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long *plVar7;
  undefined4 extraout_var_04;
  _Alloc_hider right;
  TIntermAggregate *pTVar8;
  TIntermediate *pTVar9;
  undefined4 extraout_var_06;
  TPoolAllocator *this_00;
  TIntermAggregate *pTVar10;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  uint uVar11;
  uint uVar12;
  TIntermNodePair nodePair;
  tuple<glslang::TIntermTyped_*,_glslang::TIntermTyped_*> children;
  TType targetVectorType;
  TIntermAggregate *local_e8;
  _Tp_alloc_type local_e0;
  TIntermAggregate *local_d8;
  _Alloc_hider local_d0;
  TType local_c8;
  undefined4 extraout_var_05;
  
  iVar4 = (*(trueBlock->super_TIntermNode)._vptr_TIntermNode[0x20])(trueBlock);
  if ((iVar4 == 0) &&
     (pTVar9 = (TIntermediate *)falseBlock,
     iVar4 = (*(falseBlock->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar4 == 0)) {
    nodePair.node2 = &falseBlock->super_TIntermNode;
    nodePair.node1 = &trueBlock->super_TIntermNode;
    pTVar10 = (TIntermAggregate *)addSelection(pTVar9,cond,nodePair,loc);
LAB_00498703:
    if (this->source == EShSourceHlsl) {
      *(undefined1 *)
       &(pTVar10->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
        super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = 0;
    }
  }
  else {
    addPairConversion((TIntermediate *)&local_d8,(TOperator)this,(TIntermTyped *)0x1,trueBlock);
    local_e0.allocator = (TPoolAllocator *)local_d0._M_p;
    local_e8 = local_d8;
    if (local_d8 != (TIntermAggregate *)0x0 &&
        (TIntermAggregate *)local_d0._M_p != (TIntermAggregate *)0x0) {
      iVar4 = (*(cond->super_TIntermNode)._vptr_TIntermNode[0x1e])(cond);
      cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 200))
                        ((long *)CONCAT44(extraout_var,iVar4));
      if (cVar2 == '\0') {
        plVar7 = (long *)(**(code **)(*(long *)local_d0._M_p + 0xf0))(local_d0._M_p);
        t = (**(code **)(*plVar7 + 0x38))(plVar7);
        iVar4 = (*(cond->super_TIntermNode)._vptr_TIntermNode[0x1e])(cond);
        iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar4) + 0x60))
                          ((long *)CONCAT44(extraout_var_04,iVar4));
        TType::TType(&local_c8,t,EvqTemporary,iVar4,0,0,false);
        right._M_p = local_d0._M_p;
        pTVar8 = local_d8;
        if ((this->source == EShSourceHlsl) &&
           (right._M_p = (pointer)addShapeConversion(this,&local_c8,local_d0._M_p),
           this->source == EShSourceHlsl)) {
          pTVar8 = (TIntermAggregate *)addShapeConversion(this,&local_c8,(TIntermTyped *)local_d8);
        }
        iVar4 = (*(pTVar8->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])(pTVar8);
        pTVar9 = (TIntermediate *)CONCAT44(extraout_var_05,iVar4);
        iVar4 = (*(((TIntermAggregate *)right._M_p)->super_TIntermOperator).super_TIntermTyped.
                  super_TIntermNode._vptr_TIntermNode[0x1e])(right._M_p);
        bVar3 = TType::operator==((TType *)pTVar9,(TType *)CONCAT44(extraout_var_06,iVar4));
        if (bVar3) {
          pTVar10 = makeAggregate(pTVar9,loc);
          pTVar8 = growAggregate(pTVar9,(TIntermNode *)pTVar10,(TIntermNode *)pTVar8);
          pTVar8 = growAggregate(pTVar9,(TIntermNode *)pTVar8,(TIntermNode *)right._M_p);
          pTVar8 = growAggregate(pTVar9,(TIntermNode *)pTVar8,&cond->super_TIntermNode);
          (*(pTVar8->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x1d])(pTVar8,&local_c8);
          (pTVar8->super_TIntermOperator).op = EOpMix;
          return (TIntermTyped *)pTVar8;
        }
      }
      else {
        addBiShapeConversion(this,EOpMix,(TIntermTyped **)&local_e0,(TIntermTyped **)&local_e8);
        pTVar8 = local_e8;
        iVar4 = (*(local_e8->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])(local_e8);
        node1.allocator = local_e0.allocator;
        pTVar5 = (TType *)(**(code **)(*(long *)&(((TIntermOperator *)
                                                  &(local_e0.allocator)->pageSize)->
                                                 super_TIntermTyped).super_TIntermNode + 0xf0))
                                    (local_e0.allocator);
        bVar3 = TType::operator==((TType *)CONCAT44(extraout_var_00,iVar4),pTVar5);
        if (bVar3) {
          iVar4 = (*(cond->super_TIntermNode)._vptr_TIntermNode[5])(cond);
          if (((CONCAT44(extraout_var_01,iVar4) != 0) &&
              (lVar6 = (**(code **)(*(long *)&(((TIntermOperator *)&(node1.allocator)->pageSize)->
                                              super_TIntermTyped).super_TIntermNode + 0x28))
                                 (node1.allocator), lVar6 != 0)) &&
             (iVar4 = (*(pTVar8->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                        _vptr_TIntermNode[5])(pTVar8), CONCAT44(extraout_var_02,iVar4) != 0)) {
            iVar4 = (*(cond->super_TIntermNode)._vptr_TIntermNode[5])(cond);
            if (**(char **)(*(long *)(CONCAT44(extraout_var_03,iVar4) + 0xc0) + 8) == '\0') {
              return (TIntermTyped *)pTVar8;
            }
            return (TIntermTyped *)node1.allocator;
          }
          this_00 = GetThreadPoolAllocator();
          pTVar10 = (TIntermAggregate *)TPoolAllocator::allocate(this_00,0xd8);
          pTVar5 = (TType *)(**(code **)(*(long *)&(((TIntermOperator *)&(node1.allocator)->pageSize
                                                    )->super_TIntermTyped).super_TIntermNode + 0xf0)
                            )(node1.allocator);
          TIntermTyped::TIntermTyped((TIntermTyped *)pTVar10,pTVar5);
          (pTVar10->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode =
               (_func_int **)&PTR_getLoc_00afcd58;
          *(TIntermTyped **)&(pTVar10->super_TIntermOperator).op = cond;
          (pTVar10->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
          super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
          super__Tp_alloc_type.allocator = node1.allocator;
          (pTVar10->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
          super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pTVar8;
          *(undefined2 *)
           &(pTVar10->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
            .super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish = 1;
          *(undefined1 *)
           ((long)&(pTVar10->sequence).
                   super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                   super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 2) = 0;
          TIntermNode::setLoc((TIntermNode *)pTVar10,loc);
          lVar6 = (**(code **)(*(long *)&(((TIntermOperator *)&(node1.allocator)->pageSize)->
                                         super_TIntermTyped).super_TIntermNode + 0x108))
                            (node1.allocator);
          uVar12 = *(uint *)(lVar6 + 8) >> 0x19 & 7;
          iVar4 = (*(pTVar8->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x21])(pTVar8);
          uVar11 = *(uint *)(CONCAT44(extraout_var_07,iVar4) + 8) >> 0x19 & 7;
          if (uVar11 < uVar12) {
            uVar11 = uVar12;
          }
          iVar4 = (*(pTVar10->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x21])(pTVar10);
          *(ulong *)(CONCAT44(extraout_var_08,iVar4) + 8) =
               *(ulong *)(CONCAT44(extraout_var_08,iVar4) + 8) & 0xfffffffff1ffffff |
               (ulong)(uVar11 << 0x19);
          pTVar9 = (TIntermediate *)cond;
          iVar4 = (*(cond->super_TIntermNode)._vptr_TIntermNode[0x21])();
          uVar1 = *(ulong *)(CONCAT44(extraout_var_09,iVar4) + 8);
          if ((((uVar1 & 0x10000007f) == 2 || (uVar1 >> 0x20 & 1) != 0) &&
              (bVar3 = specConstantPropagates
                                 (pTVar9,(TIntermTyped *)node1.allocator,(TIntermTyped *)pTVar8),
              bVar3)) ||
             ((iVar4 = (*(cond->super_TIntermNode)._vptr_TIntermNode[0x21])(cond),
              (*(ulong *)(CONCAT44(extraout_var_10,iVar4) + 8) & 0x100000000) != 0 &&
              ((lVar6 = (**(code **)(*(long *)&(((TIntermOperator *)&(node1.allocator)->pageSize)->
                                               super_TIntermTyped).super_TIntermNode + 0x108))
                                  (node1.allocator),
               (*(ulong *)(lVar6 + 8) & 0x10000007f) == 2 ||
               (*(ulong *)(lVar6 + 8) & 0x100000000) != 0 &&
               (iVar4 = (*(pTVar8->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                          _vptr_TIntermNode[0x21])(pTVar8),
               uVar1 = *(ulong *)(CONCAT44(extraout_var_11,iVar4) + 8),
               (uVar1 & 0x10000007f) == 2 || (uVar1 & 0x100000000) != 0)))))) {
            iVar4 = (*(pTVar10->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x21])(pTVar10);
            *(ulong *)(CONCAT44(extraout_var_12,iVar4) + 8) =
                 (*(ulong *)(CONCAT44(extraout_var_12,iVar4) + 8) & 0xfffffffeffffff80) +
                 0x100000002;
          }
          else {
            iVar4 = (*(pTVar10->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x21])(pTVar10);
            TQualifier::makeTemporary((TQualifier *)CONCAT44(extraout_var_13,iVar4));
          }
          goto LAB_00498703;
        }
      }
    }
    pTVar10 = (TIntermAggregate *)0x0;
  }
  return (TIntermTyped *)pTVar10;
}

Assistant:

TIntermTyped* TIntermediate::addSelection(TIntermTyped* cond, TIntermTyped* trueBlock, TIntermTyped* falseBlock,
                                          const TSourceLoc& loc)
{
    // If it's void, go to the if-then-else selection()
    if (trueBlock->getBasicType() == EbtVoid && falseBlock->getBasicType() == EbtVoid) {
        TIntermNodePair pair = { trueBlock, falseBlock };
        TIntermSelection* selection = addSelection(cond, pair, loc);
        if (getSource() == EShSourceHlsl)
            selection->setNoShortCircuit();

        return selection;
    }

    //
    // Get compatible types.
    //
    auto children = addPairConversion(EOpSequence, trueBlock, falseBlock);
    trueBlock = std::get<0>(children);
    falseBlock = std::get<1>(children);

    if (trueBlock == nullptr || falseBlock == nullptr)
        return nullptr;

    // Handle a vector condition as a mix
    if (!cond->getType().isScalarOrVec1()) {
        TType targetVectorType(trueBlock->getType().getBasicType(), EvqTemporary,
                               cond->getType().getVectorSize());
        // smear true/false operands as needed
        trueBlock = addUniShapeConversion(EOpMix, targetVectorType, trueBlock);
        falseBlock = addUniShapeConversion(EOpMix, targetVectorType, falseBlock);

        // After conversion, types have to match.
        if (falseBlock->getType() != trueBlock->getType())
            return nullptr;

        // make the mix operation
        TIntermAggregate* mix = makeAggregate(loc);
        mix = growAggregate(mix, falseBlock);
        mix = growAggregate(mix, trueBlock);
        mix = growAggregate(mix, cond);
        mix->setType(targetVectorType);
        mix->setOp(EOpMix);

        return mix;
    }

    // Now have a scalar condition...

    // Convert true and false expressions to matching types
    addBiShapeConversion(EOpMix, trueBlock, falseBlock);

    // After conversion, types have to match.
    if (falseBlock->getType() != trueBlock->getType())
        return nullptr;

    // Eliminate the selection when the condition is a scalar and all operands are constant.
    if (cond->getAsConstantUnion() && trueBlock->getAsConstantUnion() && falseBlock->getAsConstantUnion()) {
        if (cond->getAsConstantUnion()->getConstArray()[0].getBConst())
            return trueBlock;
        else
            return falseBlock;
    }

    //
    // Make a selection node.
    //
    TIntermSelection* node = new TIntermSelection(cond, trueBlock, falseBlock, trueBlock->getType());
    node->setLoc(loc);
    node->getQualifier().precision = std::max(trueBlock->getQualifier().precision, falseBlock->getQualifier().precision);

    if ((cond->getQualifier().isConstant() && specConstantPropagates(*trueBlock, *falseBlock)) ||
        (cond->getQualifier().isSpecConstant() && trueBlock->getQualifier().isConstant() &&
                                                 falseBlock->getQualifier().isConstant()))
        node->getQualifier().makeSpecConstant();
    else
        node->getQualifier().makeTemporary();

    if (getSource() == EShSourceHlsl)
        node->setNoShortCircuit();

    return node;
}